

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraSublimeTextGenerator::ComputeDefines_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  size_t headTarget;
  string *psVar1;
  char *expression;
  char *config_compile_defs;
  allocator<char> local_1c9;
  undefined1 local_1c8 [8];
  string defPropName;
  char *compile_defs;
  undefined1 local_198 [8];
  string COMPILE_DEFINITIONS;
  string local_158;
  undefined1 local_138 [8];
  cmGeneratorExpressionInterpreter genexInterpreter;
  string local_c8;
  string *local_a8;
  string *config;
  string *local_80;
  string *language;
  cmMakefile *local_68;
  cmMakefile *makefile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *lg_local;
  cmSourceFile *source_local;
  cmExtraSublimeTextGenerator *this_local;
  string *definesString;
  
  defines._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)target;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&makefile);
  local_68 = cmLocalGenerator::GetMakefile(lg);
  cmSourceFile::GetLanguage_abi_cxx11_((string *)&config,source);
  this_00 = local_68;
  local_80 = (string *)&config;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CMAKE_BUILD_TYPE",
             (allocator<char> *)(genexInterpreter.Language.field_2._M_local_buf + 0xf));
  psVar1 = cmMakefile::GetSafeDefinition(this_00,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)(genexInterpreter.Language.field_2._M_local_buf + 0xf));
  local_a8 = psVar1;
  std::__cxx11::string::string((string *)&local_158,(string *)psVar1);
  headTarget = defines._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::string
            ((string *)(COMPILE_DEFINITIONS.field_2._M_local_buf + 8),(string *)local_80);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_138,lg,&local_158,
             (cmGeneratorTarget *)headTarget,(string *)((long)&COMPILE_DEFINITIONS.field_2 + 8));
  std::__cxx11::string::~string((string *)(COMPILE_DEFINITIONS.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_158);
  cmLocalGenerator::GetTargetDefines
            (lg,(cmGeneratorTarget *)defines._M_t._M_impl.super__Rb_tree_header._M_node_count,
             local_a8,local_80,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"COMPILE_DEFINITIONS",(allocator<char> *)((long)&compile_defs + 7))
  ;
  std::allocator<char>::~allocator((allocator<char> *)((long)&compile_defs + 7));
  defPropName.field_2._8_8_ = cmSourceFile::GetProperty(source,(string *)local_198);
  if ((char *)defPropName.field_2._8_8_ != (char *)0x0) {
    psVar1 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_138,
                        (char *)defPropName.field_2._8_8_,(string *)local_198);
    cmLocalGenerator::AppendDefines
              (lg,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&makefile,psVar1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"COMPILE_DEFINITIONS_",&local_1c9);
  std::allocator<char>::~allocator(&local_1c9);
  cmsys::SystemTools::UpperCase((string *)&config_compile_defs,local_a8);
  std::__cxx11::string::operator+=((string *)local_1c8,(string *)&config_compile_defs);
  std::__cxx11::string::~string((string *)&config_compile_defs);
  expression = cmSourceFile::GetProperty(source,(string *)local_1c8);
  if (expression != (char *)0x0) {
    psVar1 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_138,expression,(string *)local_198
                       );
    cmLocalGenerator::AppendDefines
              (lg,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&makefile,psVar1);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cmLocalGenerator::JoinDefines
            (lg,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&makefile,__return_storage_ptr__,local_80);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::~string((string *)local_198);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_138);
  std::__cxx11::string::~string((string *)&config);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&makefile);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeDefines(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* target)

{
  std::set<std::string> defines;
  cmMakefile* makefile = lg->GetMakefile();
  const std::string& language = source->GetLanguage();
  const std::string& config = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmGeneratorExpressionInterpreter genexInterpreter(lg, config, target,
                                                    language);

  // Add preprocessor definitions for this target and configuration.
  lg->GetTargetDefines(target, config, language, defines);
  const std::string COMPILE_DEFINITIONS("COMPILE_DEFINITIONS");
  if (const char* compile_defs = source->GetProperty(COMPILE_DEFINITIONS)) {
    lg->AppendDefines(
      defines, genexInterpreter.Evaluate(compile_defs, COMPILE_DEFINITIONS));
  }

  std::string defPropName = "COMPILE_DEFINITIONS_";
  defPropName += cmSystemTools::UpperCase(config);
  if (const char* config_compile_defs = source->GetProperty(defPropName)) {
    lg->AppendDefines(
      defines,
      genexInterpreter.Evaluate(config_compile_defs, COMPILE_DEFINITIONS));
  }

  std::string definesString;
  lg->JoinDefines(defines, definesString, language);

  return definesString;
}